

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

JSAMPARRAY alloc_sarray(j_common_ptr cinfo,int pool_id,JDIMENSION samplesperrow,JDIMENSION numrows)

{
  undefined1 auVar1 [16];
  uint pool_id_00;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  JSAMPARRAY ppJVar5;
  uint in_ECX;
  uint in_EDX;
  long *in_RDI;
  long ltemp;
  JDIMENSION i;
  JDIMENSION currow;
  JDIMENSION rowsperchunk;
  JSAMPROW workspace;
  JSAMPARRAY result;
  my_mem_ptr mem;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  j_common_ptr in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int pool_id_01;
  j_common_ptr cinfo_00;
  
  pool_id_01 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  cinfo_00 = (j_common_ptr)in_RDI[1];
  if (1000000000 < in_EDX) {
    out_of_memory((j_common_ptr)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  in_stack_ffffffffffffffac);
  }
  sVar3 = round_up_pow2((ulong)in_EDX,0x40);
  auVar1 = (ZEXT816(0) << 0x40 | ZEXT816(0x3b9ac9e8)) / ZEXT416((uint)sVar3);
  uVar4 = auVar1._0_8_;
  if (uVar4 == 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x46;
    (**(code **)*in_RDI)(in_RDI);
  }
  pool_id_00 = in_ECX;
  if (uVar4 < in_ECX) {
    pool_id_00 = auVar1._0_4_;
  }
  *(uint *)&cinfo_00[4].err = pool_id_00;
  ppJVar5 = (JSAMPARRAY)alloc_small(cinfo_00,pool_id_01,(size_t)in_stack_ffffffffffffffd0);
  local_38 = 0;
  while (local_38 < in_ECX) {
    if (in_ECX - local_38 <= pool_id_00) {
      pool_id_00 = in_ECX - local_38;
    }
    in_stack_ffffffffffffffd0 =
         (j_common_ptr)
         alloc_large(in_stack_ffffffffffffffd0,pool_id_00,
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    for (uVar2 = pool_id_00; uVar2 != 0; uVar2 = uVar2 - 1) {
      ppJVar5[local_38] = (JSAMPROW)in_stack_ffffffffffffffd0;
      in_stack_ffffffffffffffd0 =
           (j_common_ptr)((long)&in_stack_ffffffffffffffd0->err + (sVar3 & 0xffffffff));
      local_38 = local_38 + 1;
    }
    in_stack_ffffffffffffffc4 = 0;
  }
  return ppJVar5;
}

Assistant:

METHODDEF(JSAMPARRAY)
alloc_sarray(j_common_ptr cinfo, int pool_id, JDIMENSION samplesperrow,
             JDIMENSION numrows)
/* Allocate a 2-D sample array */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  JSAMPARRAY result;
  JSAMPROW workspace;
  JDIMENSION rowsperchunk, currow, i;
  long ltemp;

  /* Make sure each row is properly aligned */
  if ((ALIGN_SIZE % sizeof(JSAMPLE)) != 0)
    out_of_memory(cinfo, 5);    /* safety check */

  if (samplesperrow > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 9);
  }
  samplesperrow = (JDIMENSION)round_up_pow2(samplesperrow, (2 * ALIGN_SIZE) /
                                                           sizeof(JSAMPLE));

  /* Calculate max # of rows allowed in one allocation chunk */
  ltemp = (MAX_ALLOC_CHUNK - sizeof(large_pool_hdr)) /
          ((long)samplesperrow * sizeof(JSAMPLE));
  if (ltemp <= 0)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);
  if (ltemp < (long)numrows)
    rowsperchunk = (JDIMENSION)ltemp;
  else
    rowsperchunk = numrows;
  mem->last_rowsperchunk = rowsperchunk;

  /* Get space for row pointers (small object) */
  result = (JSAMPARRAY)alloc_small(cinfo, pool_id,
                                   (size_t)(numrows * sizeof(JSAMPROW)));

  /* Get the rows themselves (large objects) */
  currow = 0;
  while (currow < numrows) {
    rowsperchunk = MIN(rowsperchunk, numrows - currow);
    workspace = (JSAMPROW)alloc_large(cinfo, pool_id,
      (size_t)((size_t)rowsperchunk * (size_t)samplesperrow *
               sizeof(JSAMPLE)));
    for (i = rowsperchunk; i > 0; i--) {
      result[currow++] = workspace;
      workspace += samplesperrow;
    }
  }

  return result;
}